

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O2

void different_stl_string_reference_and_pointer_are_not_equal(void)

{
  string *this;
  Constraint_ *pCVar1;
  allocator local_31;
  string alice;
  
  this = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this,"bob",(allocator *)&alice);
  bob_pointer_abi_cxx11_ = this;
  std::__cxx11::string::string((string *)&alice,"alice",&local_31);
  pCVar1 = (Constraint_ *)
           cgreen::create_not_equal_to_string_constraint
                     ((string *)bob_pointer_abi_cxx11_,"bob_pointer");
  cgreen::assert_that_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x8b,"alice",(string *)&alice,pCVar1);
  std::__cxx11::string::~string((string *)&alice);
  return;
}

Assistant:

Ensure(different_stl_string_reference_and_pointer_are_not_equal) {
    bob_pointer = new std::string("bob");
    std::string alice("alice");

    assert_that(alice, is_not_equal_to_string(bob_pointer));
}